

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_v4dwt_decode_step1_sse(opj_v4_t *w,OPJ_UINT32 start,OPJ_UINT32 end,__m128 c)

{
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  __m128 xmm6;
  __m128 xmm4;
  __m128 xmm2;
  __m128 xmm0;
  opj_v4_t *poStack_d0;
  OPJ_UINT32 i;
  __m128 *vw;
  __m128 c_local;
  OPJ_UINT32 end_local;
  OPJ_UINT32 start_local;
  opj_v4_t *w_local;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  poStack_d0 = w + (start << 1);
  for (xmm0[3] = (float)start; (int)xmm0[3] + 3U < end; xmm0[3] = (float)((int)xmm0[3] + 4)) {
    local_18 = (float)*(undefined8 *)poStack_d0;
    fStack_14 = (float)((ulong)*(undefined8 *)poStack_d0 >> 0x20);
    fStack_10 = (float)*(undefined8 *)(poStack_d0->f + 2);
    fStack_c = (float)((ulong)*(undefined8 *)(poStack_d0->f + 2) >> 0x20);
    local_38 = (float)*(undefined8 *)(poStack_d0 + 2);
    fStack_34 = (float)((ulong)*(undefined8 *)(poStack_d0 + 2) >> 0x20);
    fStack_30 = (float)*(undefined8 *)((long)poStack_d0 + 0x28);
    fStack_2c = (float)((ulong)*(undefined8 *)((long)poStack_d0 + 0x28) >> 0x20);
    local_58 = (float)*(undefined8 *)(poStack_d0 + 4);
    fStack_54 = (float)((ulong)*(undefined8 *)(poStack_d0 + 4) >> 0x20);
    fStack_50 = (float)*(undefined8 *)((long)poStack_d0 + 0x48);
    fStack_4c = (float)((ulong)*(undefined8 *)((long)poStack_d0 + 0x48) >> 0x20);
    local_78 = (float)*(undefined8 *)(poStack_d0 + 6);
    fStack_74 = (float)((ulong)*(undefined8 *)(poStack_d0 + 6) >> 0x20);
    fStack_70 = (float)*(undefined8 *)((long)poStack_d0 + 0x68);
    fStack_6c = (float)((ulong)*(undefined8 *)((long)poStack_d0 + 0x68) >> 0x20);
    *(ulong *)poStack_d0 = CONCAT44(fStack_14 * c[1],local_18 * c[0]);
    *(ulong *)(poStack_d0->f + 2) = CONCAT44(fStack_c * in_XMM0_Dd,fStack_10 * in_XMM0_Dc);
    *(ulong *)(poStack_d0 + 2) = CONCAT44(fStack_34 * c[1],local_38 * c[0]);
    *(ulong *)((long)poStack_d0 + 0x28) = CONCAT44(fStack_2c * in_XMM0_Dd,fStack_30 * in_XMM0_Dc);
    *(ulong *)(poStack_d0 + 4) = CONCAT44(fStack_54 * c[1],local_58 * c[0]);
    *(ulong *)((long)poStack_d0 + 0x48) = CONCAT44(fStack_4c * in_XMM0_Dd,fStack_50 * in_XMM0_Dc);
    *(ulong *)(poStack_d0 + 6) = CONCAT44(fStack_74 * c[1],local_78 * c[0]);
    *(ulong *)((long)poStack_d0 + 0x68) = CONCAT44(fStack_6c * in_XMM0_Dd,fStack_70 * in_XMM0_Dc);
    poStack_d0 = poStack_d0 + 8;
  }
  for (; (uint)xmm0[3] < end; xmm0[3] = (float)((int)xmm0[3] + 1)) {
    local_98 = (float)*(undefined8 *)poStack_d0;
    fStack_94 = (float)((ulong)*(undefined8 *)poStack_d0 >> 0x20);
    fStack_90 = (float)*(undefined8 *)(poStack_d0->f + 2);
    fStack_8c = (float)((ulong)*(undefined8 *)(poStack_d0->f + 2) >> 0x20);
    poStack_d0->f[0] = (OPJ_FLOAT32)(local_98 * c[0]);
    poStack_d0->f[1] = (OPJ_FLOAT32)(fStack_94 * c[1]);
    poStack_d0->f[2] = (OPJ_FLOAT32)(fStack_90 * in_XMM0_Dc);
    poStack_d0->f[3] = (OPJ_FLOAT32)(fStack_8c * in_XMM0_Dd);
    poStack_d0 = poStack_d0 + 2;
  }
  return;
}

Assistant:

static void opj_v4dwt_decode_step1_sse(opj_v4_t* w,
                                       OPJ_UINT32 start,
                                       OPJ_UINT32 end,
                                       const __m128 c)
{
    __m128* OPJ_RESTRICT vw = (__m128*) w;
    OPJ_UINT32 i;
    /* 4x unrolled loop */
    vw += 2 * start;
    for (i = start; i + 3 < end; i += 4, vw += 8) {
        __m128 xmm0 = _mm_mul_ps(vw[0], c);
        __m128 xmm2 = _mm_mul_ps(vw[2], c);
        __m128 xmm4 = _mm_mul_ps(vw[4], c);
        __m128 xmm6 = _mm_mul_ps(vw[6], c);
        vw[0] = xmm0;
        vw[2] = xmm2;
        vw[4] = xmm4;
        vw[6] = xmm6;
    }
    for (; i < end; ++i, vw += 2) {
        vw[0] = _mm_mul_ps(vw[0], c);
    }
}